

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O2

_Bool pool_buffer_set_c_array(chck_pool_buffer *pb,void *items,size_t memb)

{
  _Bool _Var1;
  
  if (memb == 0 || items == (void *)0x0) {
    pool_buffer_release(pb);
    memb = 0;
  }
  else {
    _Var1 = pool_buffer_resize_mul(pb,memb,pb->member);
    if (!_Var1) {
      return false;
    }
    memcpy(pb->buffer,items,pb->allocated);
  }
  pb->used = pb->allocated;
  pb->count = memb;
  return true;
}

Assistant:

static bool
pool_buffer_set_c_array(struct chck_pool_buffer *pb, const void *items, size_t memb)
{
   assert(pb);

   if (items && memb > 0) {
      if (!pool_buffer_resize_mul(pb, memb, pb->member))
         return false;

      memcpy(pb->buffer, items, pb->allocated);
   } else {
      pool_buffer_release(pb);
      memb = 0;
   }

   pb->used = pb->allocated;
   pb->count = memb;
   return true;
}